

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::PrefixedExpr(SQCompiler *this)

{
  SQLexer *this_00;
  long lVar1;
  SQFuncState *this_01;
  long lVar2;
  bool bVar3;
  SQInteger SVar4;
  SQInteger SVar5;
  SQInteger SVar6;
  SQInteger SVar7;
  SQFuncState *pSVar8;
  byte bVar9;
  byte bVar10;
  SQObject SVar11;
  SQObject local_48;
  SQInstruction local_38;
  
  Factor(this);
  this_00 = &this->_lex;
  do {
    while (lVar1 = this->_token, 0x5a < lVar1) {
      if (lVar1 != 0x5b) {
        if (1 < lVar1 - 0x12fU) {
          return;
        }
        if ((this->_lex)._prevtoken == 10) {
          return;
        }
        if (lVar1 == 0) {
          return;
        }
        if (lVar1 != 0x3b) {
          if (lVar1 == 0x7d) {
            return;
          }
          SVar4 = SQLexer::Lex(this_00);
          this->_token = SVar4;
          lVar2 = (this->_es).etype;
          if (lVar2 - 1U < 5) {
            lVar1 = (ulong)(lVar1 != 0x130) * 2 + -1;
            bVar9 = (byte)lVar1;
            switch(lVar2) {
            case 1:
              goto switchD_0011d792_caseD_1;
            default:
              if ((this->_es).donot_get != true) {
                Emit2ArgsOP(this,_OP_PINC,lVar1);
                return;
              }
switchD_0011d792_caseD_1:
              Error(this,"can\'t \'++\' or \'--\' an expression");
              return;
            case 4:
              SVar4 = SQFuncState::PopTarget(this->_fs);
              pSVar8 = this->_fs;
              SVar5 = SQFuncState::PushTarget(pSVar8,-1);
              local_48._4_1_ = 0x27;
              local_48._5_1_ = SUB81(SVar5,0);
              local_48._type = (SQObjectType)SVar4;
              local_48._6_2_ = (ushort)bVar9 << 8;
              SQFuncState::AddInstruction(pSVar8,(SQInstruction *)&local_48);
              return;
            case 5:
              SVar4 = SQFuncState::PushTarget(this->_fs,-1);
              SVar5 = SQFuncState::PushTarget(this->_fs,-1);
              local_48._type = (SQObjectType)(this->_es).epos;
              local_48._4_1_ = 0x20;
              bVar10 = (byte)SVar5;
              local_48._6_2_ = 0;
              local_48._5_1_ = bVar10;
              SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_48);
              local_48._4_1_ = 0x27;
              local_48._5_1_ = SUB81(SVar4,0);
              local_48._type = (SQObjectType)SVar5;
              local_48._6_2_ = (ushort)bVar9 << 8;
              SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_48);
              local_48._type = (SQObjectType)(this->_es).epos;
              local_48._4_1_ = 0x1f;
              local_48._7_1_ = 0;
              local_48._6_1_ = bVar10;
              local_48._5_1_ = bVar10;
              SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_48);
              SQFuncState::PopTarget(this->_fs);
              return;
            }
          }
          return;
        }
        return;
      }
      if ((this->_lex)._prevtoken == 10) {
        Error(this,"cannot brake deref/or comma needed after [exp]=exp slot declaration");
      }
      SVar4 = SQLexer::Lex(this_00);
      this->_token = SVar4;
      Expression(this);
      Expect(this,0x5d);
LAB_0011d579:
      if ((this->_es).etype == 3) {
        Emit2ArgsOP(this,_OP_GET,0);
        SVar4 = SQFuncState::TopTarget(this->_fs);
        (this->_es).etype = 1;
        (this->_es).epos = SVar4;
      }
      else {
        bVar3 = NeedGet(this);
        if (bVar3) {
          Emit2ArgsOP(this,_OP_GET,0);
        }
        (this->_es).etype = 2;
      }
    }
    if (lVar1 != 0x28) {
      if (lVar1 != 0x2e) {
        return;
      }
      SVar4 = SQLexer::Lex(this_00);
      this->_token = SVar4;
      pSVar8 = this->_fs;
      SVar4 = SQFuncState::PushTarget(pSVar8,-1);
      this_01 = this->_fs;
      SVar11 = Expect(this,0x102);
      local_48._unVal = SVar11._unVal;
      local_48._type = SVar11._type;
      SVar5 = SQFuncState::GetConstant(this_01,&local_48);
      local_38.op = '\x01';
      local_38._arg0 = (uchar)SVar4;
      local_38._arg1 = (SQInt32)SVar5;
      local_38._arg2 = '\0';
      local_38._arg3 = '\0';
      SQFuncState::AddInstruction(pSVar8,&local_38);
      goto LAB_0011d579;
    }
    lVar1 = (this->_es).etype;
    if (lVar1 == 5) {
      pSVar8 = this->_fs;
      SVar4 = SQFuncState::PushTarget(pSVar8,-1);
      local_48._type = (SQObjectType)(this->_es).epos;
      local_48._4_1_ = 0x20;
      local_48._5_1_ = SUB81(SVar4,0);
      local_48._6_2_ = 0;
      SQFuncState::AddInstruction(pSVar8,(SQInstruction *)&local_48);
      pSVar8 = this->_fs;
      SVar4 = SQFuncState::PushTarget(pSVar8,-1);
      local_48._5_1_ = SUB81(SVar4,0);
LAB_0011d6ef:
      local_48._6_2_ = 0;
      local_48._4_1_ = 10;
      local_48._type = 0;
    }
    else {
      if ((lVar1 == 3) || (lVar1 != 2)) {
        pSVar8 = this->_fs;
        SVar4 = SQFuncState::PushTarget(pSVar8,-1);
        local_48._5_1_ = SUB81(SVar4,0);
        goto LAB_0011d6ef;
      }
      SVar4 = SQFuncState::PopTarget(this->_fs);
      SVar5 = SQFuncState::PopTarget(this->_fs);
      SVar6 = SQFuncState::PushTarget(this->_fs,-1);
      SVar7 = SQFuncState::PushTarget(this->_fs,-1);
      pSVar8 = this->_fs;
      local_48._4_1_ = 7;
      local_48._5_1_ = SUB81(SVar6,0);
      local_48._type = (SQObjectType)SVar4;
      local_48._7_1_ = (char)SVar7;
      local_48._6_1_ = (char)SVar5;
    }
    SQFuncState::AddInstruction(pSVar8,(SQInstruction *)&local_48);
    (this->_es).etype = 1;
    SVar4 = SQLexer::Lex(this_00);
    this->_token = SVar4;
    FunctionCallArgs(this);
  } while( true );
}

Assistant:

void PrefixedExpr()
    {
        SQInteger pos = Factor();
        for(;;) {
            switch(_token) {
            case _SC('.'):
                pos = -1;
                Lex();

                _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(Expect(TK_IDENTIFIER)));
                if(_es.etype==BASE) {
                    Emit2ArgsOP(_OP_GET);
                    pos = _fs->TopTarget();
                    _es.etype = EXPR;
                    _es.epos   = pos;
                }
                else {
                    if(NeedGet()) {
                        Emit2ArgsOP(_OP_GET);
                    }
                    _es.etype = OBJECT;
                }
                break;
            case _SC('['):
                if(_lex._prevtoken == _SC('\n')) Error(_SC("cannot brake deref/or comma needed after [exp]=exp slot declaration"));
                Lex(); Expression(); Expect(_SC(']'));
                pos = -1;
                if(_es.etype==BASE) {
                    Emit2ArgsOP(_OP_GET);
                    pos = _fs->TopTarget();
                    _es.etype = EXPR;
                    _es.epos   = pos;
                }
                else {
                    if(NeedGet()) {
                        Emit2ArgsOP(_OP_GET);
                    }
                    _es.etype = OBJECT;
                }
                break;
            case TK_MINUSMINUS:
            case TK_PLUSPLUS:
                {
                    if(IsEndOfStatement()) return;
                    SQInteger diff = (_token==TK_MINUSMINUS) ? -1 : 1;
                    Lex();
                    switch(_es.etype)
                    {
                        case EXPR: Error(_SC("can't '++' or '--' an expression")); break;
                        case OBJECT:
                        case BASE:
                            if(_es.donot_get == true)  { Error(_SC("can't '++' or '--' an expression")); break; } //mmh dor this make sense?
                            Emit2ArgsOP(_OP_PINC, diff);
                            break;
                        case LOCAL: {
                            SQInteger src = _fs->PopTarget();
                            _fs->AddInstruction(_OP_PINCL, _fs->PushTarget(), src, 0, diff);
                                    }
                            break;
                        case OUTER: {
                            SQInteger tmp1 = _fs->PushTarget();
                            SQInteger tmp2 = _fs->PushTarget();
                            _fs->AddInstruction(_OP_GETOUTER, tmp2, _es.epos);
                            _fs->AddInstruction(_OP_PINCL,    tmp1, tmp2, 0, diff);
                            _fs->AddInstruction(_OP_SETOUTER, tmp2, _es.epos, tmp2);
                            _fs->PopTarget();
                        }
                    }
                }
                return;
                break;
            case _SC('('):
                switch(_es.etype) {
                    case OBJECT: {
                        SQInteger key     = _fs->PopTarget();  /* location of the key */
                        SQInteger table   = _fs->PopTarget();  /* location of the object */
                        SQInteger closure = _fs->PushTarget(); /* location for the closure */
                        SQInteger ttarget = _fs->PushTarget(); /* location for 'this' pointer */
                        _fs->AddInstruction(_OP_PREPCALL, closure, key, table, ttarget);
                        }
                        break;
                    case BASE:
                        //Emit2ArgsOP(_OP_GET);
                        _fs->AddInstruction(_OP_MOVE, _fs->PushTarget(), 0);
                        break;
                    case OUTER:
                        _fs->AddInstruction(_OP_GETOUTER, _fs->PushTarget(), _es.epos);
                        _fs->AddInstruction(_OP_MOVE,     _fs->PushTarget(), 0);
                        break;
                    default:
                        _fs->AddInstruction(_OP_MOVE, _fs->PushTarget(), 0);
                }
                _es.etype = EXPR;
                Lex();
                FunctionCallArgs();
                break;
            default: return;
            }
        }
    }